

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O0

bool __thiscall CppUnit::Test::findTestPath(Test *this,string *testName,TestPath *testPath)

{
  __type _Var1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  uint local_58;
  int childIndex;
  int childCount;
  Test *local_30;
  Test *mutableThis;
  TestPath *testPath_local;
  string *testName_local;
  Test *this_local;
  
  local_30 = this;
  mutableThis = (Test *)testPath;
  testPath_local = (TestPath *)testName;
  testName_local = (string *)this;
  (*this->_vptr_Test[6])(&childIndex);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &childIndex,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          testPath_local);
  std::__cxx11::string::~string((string *)&childIndex);
  if (_Var1) {
    (*mutableThis->_vptr_Test[3])(mutableThis,local_30);
    this_local._7_1_ = true;
  }
  else {
    iVar2 = (*this->_vptr_Test[4])();
    for (local_58 = 0; (int)local_58 < iVar2; local_58 = local_58 + 1) {
      iVar3 = (*this->_vptr_Test[5])(this,(ulong)local_58);
      uVar4 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x38))
                        ((long *)CONCAT44(extraout_var,iVar3),testPath_local,mutableThis);
      if ((uVar4 & 1) != 0) {
        (*mutableThis->_vptr_Test[5])(mutableThis,local_30,0);
        return true;
      }
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool 
Test::findTestPath( const std::string &testName,
                    TestPath &testPath ) const
{
  Test *mutableThis = CPPUNIT_CONST_CAST( Test *, this );
  if ( getName() == testName )
  {
    testPath.add( mutableThis );
    return true;
  }

  int childCount = getChildTestCount();
  for ( int childIndex =0; childIndex < childCount; ++childIndex )
  {
    if ( getChildTestAt( childIndex )->findTestPath( testName, testPath ) )
    {
      testPath.insert( mutableThis, 0 );
      return true;
    }
  }

  return false;
}